

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O2

basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
kainjow::mustache::basic_mustache<std::__cxx11::string>::render<std::__cxx11::ostringstream>
          (basic_mustache<std::__cxx11::string> *this,
          basic_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *data,basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *stream)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = Catch::clara::std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:908:22)>
             ::_M_invoke;
  local_18 = Catch::clara::std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kainjow[P]Mustache/mustache.hpp:908:22)>
             ::_M_manager;
  local_28._M_unused._0_8_ = (undefined8)stream;
  basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  render((basic_mustache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)this,data,(render_handler *)&local_28);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return stream;
}

Assistant:

stream_type& render(const basic_data<string_type>& data, stream_type& stream) {
        render(data, [&stream](const string_type& str) {
            stream << str;
        });
        return stream;
    }